

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

void file_archive(char *fname,char *append)

{
  char *pcVar1;
  _Bool _Var2;
  char *pcVar3;
  char *local_850;
  char *local_838;
  uint local_81c;
  int max_arch;
  int i;
  char old [1024];
  char arch [1024];
  char *append_local;
  char *fname_local;
  
  pcVar1 = ANGBAND_DIR_ARCHIVE;
  if (append == (char *)0x0) {
    for (local_81c = 1; pcVar1 = ANGBAND_DIR_ARCHIVE, (int)local_81c < 10000;
        local_81c = local_81c + 1) {
      if (archive_user_pfx == (char *)0x0) {
        local_850 = "";
      }
      else {
        local_850 = archive_user_pfx;
      }
      pcVar3 = format("%s%s_%d.txt",local_850,fname,(ulong)local_81c);
      path_build(old + 0x3f8,0x400,pcVar1,pcVar3);
      _Var2 = file_exists(old + 0x3f8);
      if (!_Var2) break;
      my_strcpy(old + 0x3f8,"",0x400);
    }
  }
  else {
    if (archive_user_pfx == (char *)0x0) {
      local_838 = "";
    }
    else {
      local_838 = archive_user_pfx;
    }
    pcVar3 = format("%s%s_%s.txt",local_838,fname,append);
    path_build(old + 0x3f8,0x400,pcVar1,pcVar3);
  }
  pcVar1 = ANGBAND_DIR_USER;
  pcVar3 = format("%s.txt",fname);
  path_build((char *)&max_arch,0x400,pcVar1,pcVar3);
  safe_setuid_grab();
  file_move((char *)&max_arch,old + 0x3f8);
  safe_setuid_drop();
  return;
}

Assistant:

void file_archive(const char *fname, const char *append)
{
	char arch[1024];
	char old[1024];
	int i, max_arch = 10000;

	/* Add a suffix to the filename, custom if requested */
	if (append) {
		path_build(arch, sizeof(arch), ANGBAND_DIR_ARCHIVE,
			format("%s%s_%s.txt",
			(archive_user_pfx) ? archive_user_pfx : "", fname,
			append));
	} else {
		/* Check the indices of existing archived files, get the next one */
		for (i = 1; i < max_arch; i++) {
			path_build(arch, sizeof(arch), ANGBAND_DIR_ARCHIVE,
				format("%s%s_%d.txt",
				(archive_user_pfx) ? archive_user_pfx : "",
				fname, i));
			if (!file_exists(arch)) break;
			my_strcpy(arch, "", sizeof(arch));
		} 
	}

	/* Move the file */
	path_build(old, sizeof(old), ANGBAND_DIR_USER, format("%s.txt", fname));
	safe_setuid_grab();
	file_move(old, arch);
	safe_setuid_drop();
}